

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clara.hpp
# Opt level: O2

void __thiscall
clara::detail::BasicResult<clara::detail::ParseResultType>::~BasicResult
          (BasicResult<clara::detail::ParseResultType> *this)

{
  ~BasicResult(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

explicit BasicResult( BasicResult<U> const &other )
        :   ResultValueBase<T>( other.type() ),
            m_errorMessage( other.errorMessage() )
        {
            assert( type() != ResultBase::Ok );
        }